

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

double __thiscall asmjit::FileLogger::_log(FileLogger *this,double __x)

{
  FILE *__s;
  size_t in_RDX;
  char *in_RSI;
  double extraout_XMM0_Qa;
  
  __s = (FILE *)this->_stream;
  if (__s != (FILE *)0x0) {
    if (in_RDX == 0xffffffffffffffff) {
      in_RDX = strlen(in_RSI);
    }
    fwrite(in_RSI,1,in_RDX,__s);
    __x = extraout_XMM0_Qa;
  }
  return __x;
}

Assistant:

Error FileLogger::_log(const char* buf, size_t len) noexcept {
  if (!_stream)
    return kErrorOk;

  if (len == Globals::kInvalidIndex)
    len = strlen(buf);

  fwrite(buf, 1, len, _stream);
  return kErrorOk;
}